

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3Utf16to8(sqlite3 *db,void *z,int nByte,u8 enc)

{
  undefined1 local_58 [8];
  Mem m;
  u8 enc_local;
  int nByte_local;
  void *z_local;
  sqlite3 *db_local;
  
  m.xDel._3_1_ = enc;
  m.xDel._4_4_ = nByte;
  memset(local_58,0,0x38);
  m._16_8_ = db;
  sqlite3VdbeMemSetStr
            ((Mem *)local_58,(char *)z,(long)m.xDel._4_4_,m.xDel._3_1_,(_func_void_void_ptr *)0x0);
  sqlite3VdbeChangeEncoding((Mem *)local_58,1);
  if (db->mallocFailed != '\0') {
    sqlite3VdbeMemRelease((Mem *)local_58);
    m.u.r = 0.0;
  }
  return (char *)m.u.r;
}

Assistant:

SQLITE_PRIVATE char *sqlite3Utf16to8(sqlite3 *db, const void *z, int nByte, u8 enc){
  Mem m;
  memset(&m, 0, sizeof(m));
  m.db = db;
  sqlite3VdbeMemSetStr(&m, z, nByte, enc, SQLITE_STATIC);
  sqlite3VdbeChangeEncoding(&m, SQLITE_UTF8);
  if( db->mallocFailed ){
    sqlite3VdbeMemRelease(&m);
    m.z = 0;
  }
  assert( (m.flags & MEM_Term)!=0 || db->mallocFailed );
  assert( (m.flags & MEM_Str)!=0 || db->mallocFailed );
  assert( m.z || db->mallocFailed );
  return m.z;
}